

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_lib.c
# Opt level: O1

void BN_consttime_swap(unsigned_long condition,BIGNUM *a,BIGNUM *b,int nwords)

{
  unsigned_long *puVar1;
  unsigned_long *puVar2;
  ulong *puVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar4 = 0xffffffffffffffff - ((long)(condition - 1) >> 0x3f);
  uVar5 = (uint)uVar4 & (b->top ^ a->top);
  a->top = a->top ^ uVar5;
  b->top = b->top ^ uVar5;
  switch(nwords) {
  default:
    if (10 < nwords) {
      puVar1 = a->d;
      puVar2 = b->d;
      uVar6 = 10;
      do {
        uVar7 = puVar1[uVar6];
        uVar8 = (puVar2[uVar6] ^ uVar7) & uVar4;
        puVar1[uVar6] = uVar7 ^ uVar8;
        puVar3 = puVar2 + uVar6;
        *puVar3 = *puVar3 ^ uVar8;
        uVar6 = uVar6 + 1;
      } while ((uint)nwords != uVar6);
    }
  case 10:
    uVar6 = a->d[9];
    puVar1 = b->d;
    uVar7 = (puVar1[9] ^ uVar6) & uVar4;
    a->d[9] = uVar6 ^ uVar7;
    puVar3 = puVar1 + 9;
    *puVar3 = *puVar3 ^ uVar7;
  case 9:
    uVar6 = a->d[8];
    puVar1 = b->d;
    uVar7 = (puVar1[8] ^ uVar6) & uVar4;
    a->d[8] = uVar6 ^ uVar7;
    puVar3 = puVar1 + 8;
    *puVar3 = *puVar3 ^ uVar7;
  case 8:
    uVar6 = a->d[7];
    puVar1 = b->d;
    uVar7 = (puVar1[7] ^ uVar6) & uVar4;
    a->d[7] = uVar6 ^ uVar7;
    puVar3 = puVar1 + 7;
    *puVar3 = *puVar3 ^ uVar7;
  case 7:
    uVar6 = a->d[6];
    puVar1 = b->d;
    uVar7 = (puVar1[6] ^ uVar6) & uVar4;
    a->d[6] = uVar6 ^ uVar7;
    puVar3 = puVar1 + 6;
    *puVar3 = *puVar3 ^ uVar7;
  case 6:
    uVar6 = a->d[5];
    puVar1 = b->d;
    uVar7 = (puVar1[5] ^ uVar6) & uVar4;
    a->d[5] = uVar6 ^ uVar7;
    puVar3 = puVar1 + 5;
    *puVar3 = *puVar3 ^ uVar7;
  case 5:
    uVar6 = a->d[4];
    puVar1 = b->d;
    uVar7 = (puVar1[4] ^ uVar6) & uVar4;
    a->d[4] = uVar6 ^ uVar7;
    puVar3 = puVar1 + 4;
    *puVar3 = *puVar3 ^ uVar7;
  case 4:
    uVar6 = a->d[3];
    puVar1 = b->d;
    uVar7 = (puVar1[3] ^ uVar6) & uVar4;
    a->d[3] = uVar6 ^ uVar7;
    puVar3 = puVar1 + 3;
    *puVar3 = *puVar3 ^ uVar7;
  case 3:
    uVar6 = a->d[2];
    puVar1 = b->d;
    uVar7 = (puVar1[2] ^ uVar6) & uVar4;
    a->d[2] = uVar6 ^ uVar7;
    puVar3 = puVar1 + 2;
    *puVar3 = *puVar3 ^ uVar7;
  case 2:
    uVar6 = a->d[1];
    puVar1 = b->d;
    uVar7 = (puVar1[1] ^ uVar6) & uVar4;
    a->d[1] = uVar6 ^ uVar7;
    puVar3 = puVar1 + 1;
    *puVar3 = *puVar3 ^ uVar7;
  case 1:
    uVar6 = *a->d;
    puVar3 = b->d;
    uVar4 = (*puVar3 ^ uVar6) & uVar4;
    *a->d = uVar6 ^ uVar4;
    *puVar3 = *puVar3 ^ uVar4;
    return;
  }
}

Assistant:

void BN_consttime_swap(BN_ULONG condition, BIGNUM *a, BIGNUM *b, int nwords)
{
    BN_ULONG t;
    int i;

    bn_wcheck_size(a, nwords);
    bn_wcheck_size(b, nwords);

    assert(a != b);
    assert((condition & (condition - 1)) == 0);
    assert(sizeof(BN_ULONG) >= sizeof(int));

    condition = ((condition - 1) >> (BN_BITS2 - 1)) - 1;

    t = (a->top ^ b->top) & condition;
    a->top ^= t;
    b->top ^= t;

#define BN_CONSTTIME_SWAP(ind) \
        do { \
                t = (a->d[ind] ^ b->d[ind]) & condition; \
                a->d[ind] ^= t; \
                b->d[ind] ^= t; \
        } while (0)

    switch (nwords) {
    default:
        for (i = 10; i < nwords; i++)
            BN_CONSTTIME_SWAP(i);
        /* Fallthrough */
    case 10:
        BN_CONSTTIME_SWAP(9);   /* Fallthrough */
    case 9:
        BN_CONSTTIME_SWAP(8);   /* Fallthrough */
    case 8:
        BN_CONSTTIME_SWAP(7);   /* Fallthrough */
    case 7:
        BN_CONSTTIME_SWAP(6);   /* Fallthrough */
    case 6:
        BN_CONSTTIME_SWAP(5);   /* Fallthrough */
    case 5:
        BN_CONSTTIME_SWAP(4);   /* Fallthrough */
    case 4:
        BN_CONSTTIME_SWAP(3);   /* Fallthrough */
    case 3:
        BN_CONSTTIME_SWAP(2);   /* Fallthrough */
    case 2:
        BN_CONSTTIME_SWAP(1);   /* Fallthrough */
    case 1:
        BN_CONSTTIME_SWAP(0);
    }
#undef BN_CONSTTIME_SWAP
}